

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrate.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pbVar5;
  FileStorage *pFVar6;
  string local_3f8 [39];
  allocator<char> local_3d1;
  string local_3d0 [8];
  string fn_params;
  FileStorage fs;
  TermCriteria local_370;
  _OutputArray local_360;
  _OutputArray local_348;
  _InputOutputArray local_330;
  _InputOutputArray local_318;
  Size_<int> local_300;
  _InputArray local_2f8;
  _InputArray local_2e0;
  undefined1 local_2c8 [8];
  vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> tvecs;
  vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> rvecs;
  Mat dis_cef;
  Mat local_238 [8];
  Mat cam_mtx;
  _OutputArray local_1d8;
  Size_<int> local_1c0;
  _InputArray local_1b8;
  undefined1 local_1a0 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pts;
  string local_180 [8];
  Mat image;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fn;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Size image_size;
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  vpts3d;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  vpts2d;
  float local_c0;
  float local_bc;
  int local_b8;
  int local_b4;
  int x;
  int y;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tmp;
  float space;
  int cols;
  int rows;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fns;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string fp_images;
  char **argv_local;
  int argc_local;
  
  fp_images.field_2._8_8_ = argv;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "0. Calibrate: input some images then get camera intrinsic params.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"../images",&local_39);
  std::allocator<char>::~allocator(&local_39);
  if (1 < argc) {
    std::__cxx11::string::operator=((string *)local_38,*(char **)(fp_images.field_2._8_8_ + 8));
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"image folder: ");
  poVar3 = std::operator<<(poVar3,(string *)local_38);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rows,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "/*.jpg");
  cv::glob(&rows,local_68,0);
  std::__cxx11::string::~string((string *)&rows);
  poVar3 = std::operator<<((ostream *)&std::cout,"num of images: ");
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68);
  if (sVar4 < 3) {
    poVar3 = std::operator<<((ostream *)&std::cout,"too few images, abort");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    tmp.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 9;
    tmp.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x42480000;
    std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
              ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)&x);
    for (local_b4 = 0; local_b4 < 6; local_b4 = local_b4 + 1) {
      for (local_b8 = 0; local_b8 < 9; local_b8 = local_b8 + 1) {
        local_bc = (float)local_b8 * 50.0;
        local_c0 = (float)local_b4 * 50.0;
        vpts2d.
        super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
        emplace_back<float,float,float>
                  ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&x,&local_bc,
                   &local_c0,
                   (float *)((long)&vpts2d.
                                    super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
    }
    std::
    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ::vector((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
              *)&vpts3d.
                 super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ::vector((vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
              *)&image_size);
    cv::Size_<int>::Size_((Size_<int> *)&__range1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
    fn = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&fn), bVar1) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      cv::imread(local_180,(int)pbVar5);
      bVar2 = cv::Mat::empty();
      if ((bVar2 & 1) == 0) {
        cv::MatSize::operator()
                  ((MatSize *)
                   &pts.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        cv::Size_<int>::operator=
                  ((Size_<int> *)&__range1,
                   (Size_<int> *)
                   &pts.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                  ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_1a0);
        cv::_InputArray::_InputArray(&local_1b8,(Mat *)local_180);
        cv::Size_<int>::Size_(&local_1c0,9,6);
        cv::_OutputArray::_OutputArray<cv::Point_<float>>
                  (&local_1d8,
                   (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_1a0);
        bVar2 = cv::findChessboardCorners(&local_1b8,&local_1c0,&local_1d8,3);
        cv::_OutputArray::~_OutputArray(&local_1d8);
        cv::_InputArray::~_InputArray(&local_1b8);
        if ((bVar2 & 1) != 0) {
          std::
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          ::push_back((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                       *)&vpts3d.
                          super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1a0
                     );
          std::
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          ::push_back((vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                       *)&image_size,(value_type *)&x);
        }
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                  ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_1a0);
      }
      cv::Mat::~Mat((Mat *)local_180);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    sVar4 = std::
            vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
            ::size((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                    *)&vpts3d.
                       super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar4 < 3) {
      poVar3 = std::operator<<((ostream *)&std::cout,"too few valid images, abort");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      cv::Mat::Mat(local_238);
      cv::Mat::Mat((Mat *)&rvecs.
                           super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>::vector
                ((vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> *)
                 &tvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>::vector
                ((vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> *)local_2c8);
      cv::_InputArray::_InputArray<cv::Point3_<float>>
                (&local_2e0,
                 (vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                  *)&image_size);
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_2f8,
                 (vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                  *)&vpts3d.
                     super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::Size_<int>::Size_(&local_300,(Size_<int> *)&__range1);
      cv::_InputOutputArray::_InputOutputArray(&local_318,local_238);
      cv::_InputOutputArray::_InputOutputArray
                (&local_330,
                 (Mat *)&rvecs.
                         super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::_OutputArray<cv::Vec<double,3>>
                (&local_348,
                 (vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> *)
                 &tvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::_OutputArray<cv::Vec<double,3>>
                (&local_360,
                 (vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> *)local_2c8);
      cv::TermCriteria::TermCriteria(&local_370,3,0x1e,2.220446049250313e-16);
      cv::calibrateCamera(&local_2e0,&local_2f8,&local_300,&local_318,&local_330,&local_348,
                          &local_360,0,local_370.type,local_370.epsilon._0_4_);
      cv::_OutputArray::~_OutputArray(&local_360);
      cv::_OutputArray::~_OutputArray(&local_348);
      cv::_InputOutputArray::~_InputOutputArray(&local_330);
      cv::_InputOutputArray::~_InputOutputArray(&local_318);
      cv::_InputArray::~_InputArray(&local_2f8);
      cv::_InputArray::~_InputArray(&local_2e0);
      cv::FileStorage::FileStorage((FileStorage *)(fn_params.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3d0,"params.json",&local_3d1);
      std::allocator<char>::~allocator(&local_3d1);
      std::__cxx11::string::string(local_3f8);
      bVar2 = cv::FileStorage::open
                        ((string *)(fn_params.field_2._M_local_buf + 8),(int)local_3d0,(string *)0x1
                        );
      std::__cxx11::string::~string(local_3f8);
      if ((bVar2 & 1) != 0) {
        pFVar6 = cv::operator<<((FileStorage *)(fn_params.field_2._M_local_buf + 8),"cam_mtx");
        cv::operator<<(pFVar6,local_238);
        pFVar6 = cv::operator<<((FileStorage *)(fn_params.field_2._M_local_buf + 8),"dis_cef");
        cv::operator<<(pFVar6,(Mat *)&rvecs.
                                      super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pFVar6 = cv::operator<<((FileStorage *)(fn_params.field_2._M_local_buf + 8),"image_size");
        cv::operator<<(pFVar6,(Size_<int> *)&__range1);
        poVar3 = std::operator<<((ostream *)&std::cout,"params written to ");
        poVar3 = std::operator<<(poVar3,local_3d0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string(local_3d0);
      cv::FileStorage::~FileStorage((FileStorage *)(fn_params.field_2._M_local_buf + 8));
      std::vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>::~vector
                ((vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> *)local_2c8);
      std::vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>::~vector
                ((vector<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_> *)
                 &tvecs.super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::Mat::~Mat((Mat *)&rvecs.
                            super__Vector_base<cv::Vec<double,_3>,_std::allocator<cv::Vec<double,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::Mat::~Mat(local_238);
    }
    std::
    vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ::~vector((vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
               *)&image_size);
    std::
    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ::~vector((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *)&vpts3d.
                  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~vector
              ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)&x);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    cout << "0. Calibrate: input some images then get camera intrinsic params." << endl;

    string fp_images = "../images";
    if (argc > 1)
        fp_images = argv[1];
    cout << "image folder: " << fp_images << endl;

    // find images
    vector<String> fns;
    glob(fp_images + "/*.jpg", fns);
    cout << "num of images: " << fns.size() << endl;
    if (fns.size() < 3) {
        cout << "too few images, abort" << endl;
        return 0;
    }

    // detect points
    const int rows = 6;
    const int cols = 9;
    const float space = 50;
    vector<Point3f> tmp;
    for (int y = 0; y < rows; ++y)
        for (int x = 0; x < cols; ++x)
            tmp.emplace_back(x * space, y * space, 0.f);
    vector<vector<Point2f>> vpts2d;
    vector<vector<Point3f>> vpts3d;
    Size image_size;
    for (const auto& fn : fns) {
        auto image = imread(fn, IMREAD_GRAYSCALE);
        if (image.empty())
            continue;
        image_size = image.size();
        vector<Point2f> pts;
        if (findChessboardCorners(image, { cols, rows }, pts)) {
            vpts2d.push_back(pts);
            vpts3d.push_back(tmp);
        }
    }
    if (vpts2d.size() < 3) {
        cout << "too few valid images, abort" << endl;
        return 0;
    }

    // calibrate
    Mat cam_mtx, dis_cef;
    vector<Vec3d> rvecs, tvecs;
    calibrateCamera(vpts3d, vpts2d, image_size, cam_mtx, dis_cef, rvecs, tvecs);

    // output
    FileStorage fs;
    string fn_params = "params.json";
    if (fs.open(fn_params, FileStorage::WRITE)) {
        fs << "cam_mtx" << cam_mtx;
        fs << "dis_cef" << dis_cef;
        fs << "image_size" << image_size;
        cout << "params written to " << fn_params << endl;
    }

    return 0;
}